

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

bool __thiscall
gl3cts::ClipDistance::NegativeTest::testMaxClipDistancesBuildingErrors
          (NegativeTest *this,Functions *gl)

{
  ostringstream *this_00;
  Program program;
  allocator<char> local_25a;
  allocator<char> local_259;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  Program local_218;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,m_vertex_shader_code_case_1,&local_259);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,m_fragment_shader_code,&local_25a);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Utility::Program::Program(&local_218,gl,(string *)local_198,&local_258,&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  if (local_218.m_program_status.program_id != 0) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Functional test have failed. Building shader with explicit redeclaration of gl_ClipDistance[] array with size (gl_MaxClipDistances + 1) has unexpectedly succeeded."
               ,0xa3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  Utility::Program::~Program(&local_218);
  return local_218.m_program_status.program_id == 0;
}

Assistant:

bool gl3cts::ClipDistance::NegativeTest::testMaxClipDistancesBuildingErrors(const glw::Functions& gl)
{
	/* Check that building shader program fails when gl_ClipDistance is
	 redeclared in the shader with size higher than GL_MAX_CLIP_DISTANCES. */

	gl3cts::ClipDistance::Utility::Program program(gl, m_vertex_shader_code_case_1, m_fragment_shader_code);

	if (program.ProgramStatus().program_id)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Functional test have failed. "
							  "Building shader with explicit redeclaration of gl_ClipDistance[] array with size "
							  "(gl_MaxClipDistances + 1) has unexpectedly succeeded."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}